

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O0

void __thiscall
HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::iterator
          (iterator *this,HighsInt *nodeIndex,double *nodeValue,HighsInt *nodeLeft,
          HighsInt *nodeRight,HighsInt node)

{
  vector<int,_std::allocator<int>_> *in_RCX;
  long in_RDX;
  long in_RSI;
  HighsSliceNonzero *in_RDI;
  double *in_R8;
  int in_R9D;
  value_type_conflict2 *in_stack_ffffffffffffffa8;
  
  HighsSliceNonzero::HighsSliceNonzero
            (in_RDI,(HighsInt *)(in_RSI + (long)in_R9D * 4),(double *)(in_RDX + (long)in_R9D * 8));
  in_RDI[1].index_ = (HighsInt *)in_RCX;
  in_RDI[1].value_ = in_R8;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7295ad);
  *(int *)&in_RDI[3].value_ = in_R9D;
  std::vector<int,_std::allocator<int>_>::reserve(in_RCX,(size_type)in_R8);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_RDI,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

iterator(const HighsInt* nodeIndex, const double* nodeValue,
             const HighsInt* nodeLeft, const HighsInt* nodeRight, HighsInt node)
        : pos_(nodeIndex + node, nodeValue + node),
          nodeLeft(nodeLeft),
          nodeRight(nodeRight),
          currentNode(node) {
      stack.reserve(16);
      stack.push_back(-1);
    }